

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.c
# Opt level: O0

int match(char *pat,char *str)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  int iVar4;
  bool bVar5;
  bool local_d2;
  int slen;
  int e;
  int blen;
  int i;
  char *buf;
  char *mbuf;
  char local_a8 [4];
  int m;
  char Xbuf [128];
  uint local_1c;
  int found;
  char *str_local;
  char *pat_local;
  
  local_1c = 0;
  mbuf._4_4_ = 0x7f;
  buf = (char *)0x0;
  _blen = local_a8;
  e = 0;
  while( true ) {
    bVar5 = false;
    if (local_1c == 0) {
      bVar5 = pat[e] != '\0';
    }
    if (!bVar5) break;
    sVar2 = strcspn(pat + e,",|");
    iVar1 = (int)sVar2;
    if (mbuf._4_4_ < iVar1) {
      mbuf._4_4_ = iVar1 + 0x80;
      _blen = (char *)realloc(buf,(long)(iVar1 + 0x81));
      buf = _blen;
    }
    memcpy(_blen,pat + e,(long)iVar1);
    _blen[iVar1] = '\0';
    if ((iVar1 < 1) || (_blen[iVar1 + -1] != '$')) {
      pcVar3 = strstr(str,_blen);
      local_d2 = pcVar3 != (char *)0x0;
    }
    else {
      sVar2 = strlen(str);
      iVar4 = iVar1 + -1;
      _blen[iVar4] = '\0';
      local_d2 = false;
      if (iVar4 <= (int)sVar2) {
        iVar4 = strcmp(str + ((int)sVar2 - iVar4),_blen);
        local_d2 = iVar4 == 0;
      }
    }
    local_1c = (uint)local_d2;
    sVar2 = strspn(pat + (e + iVar1),",|");
    e = e + iVar1 + (int)sVar2;
  }
  free(buf);
  return local_1c;
}

Assistant:

static int match (const char *pat, const char *str) {
	static const char seps[] = ",|";
	int found = 0;
	char Xbuf[128];
	int m = sizeof (Xbuf) - 1;
	char *mbuf = NULL;
	char *buf = Xbuf;
	int i = 0;
	while (!found && pat[i] != '\0') {
		int blen = strcspn (&pat[i], seps);
		int e = i + blen;
		if (blen > m) {
			m = blen + 128;
			buf = mbuf = (char *) realloc (mbuf, m + 1);
		}
		memcpy (buf, &pat[i], blen);
		buf[blen] = '\0';
		if (blen > 0 && buf[blen - 1] == '$') {
			int slen = strlen (str);
			buf[--blen] = 0;
			found = (slen >= blen &&
				 strcmp (&str[slen-blen], buf) == 0);
		} else {
			found = (strstr (str, buf) != NULL);
		}
		i = e + strspn (&pat[e], seps);
	}
	free (mbuf);
	return (found);
}